

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

unsigned_short __thiscall
btAxisSweep3Internal<unsigned_short>::addHandle
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          void *pOwner,short collisionFilterGroup,short collisionFilterMask,btDispatcher *dispatcher
          ,void *multiSapProxy)

{
  short *psVar1;
  Handle *pHVar2;
  long lVar3;
  uint uVar4;
  unsigned_short uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  unsigned_short max [3];
  unsigned_short min [3];
  
  quantize(this,min,aabbMin,0);
  quantize(this,max,aabbMax,1);
  uVar5 = allocHandle(this);
  pHVar2 = this->m_pHandles;
  pHVar2[uVar5].super_btBroadphaseProxy.m_uniqueId = (uint)uVar5;
  pHVar2[uVar5].super_btBroadphaseProxy.m_clientObject = pOwner;
  pHVar2[uVar5].super_btBroadphaseProxy.m_collisionFilterGroup = collisionFilterGroup;
  pHVar2[uVar5].super_btBroadphaseProxy.m_collisionFilterMask = collisionFilterMask;
  pHVar2[uVar5].super_btBroadphaseProxy.m_multiSapParentProxy = multiSapProxy;
  uVar4 = *(int *)&this->m_numHandles * 2;
  uVar6 = uVar4 & 0xffff;
  lVar7 = (long)(int)(uVar6 - 1);
  for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 2) {
    psVar1 = (short *)((long)this->m_pHandles->m_maxEdges + lVar8);
    *psVar1 = *psVar1 + 2;
    lVar3 = *(long *)((long)this->m_pEdges + lVar8 * 4);
    *(undefined4 *)(lVar3 + (ulong)(uVar6 + 1) * 4) = *(undefined4 *)(lVar3 + lVar7 * 4);
    lVar3 = *(long *)((long)this->m_pEdges + lVar8 * 4);
    *(undefined2 *)(lVar3 + lVar7 * 4) = *(undefined2 *)((long)min + lVar8);
    *(unsigned_short *)(lVar3 + 2 + lVar7 * 4) = uVar5;
    *(undefined2 *)(lVar3 + (ulong)uVar6 * 4) = *(undefined2 *)((long)max + lVar8);
    *(unsigned_short *)(lVar3 + 2 + (ulong)uVar6 * 4) = uVar5;
    *(short *)((long)(&pHVar2[uVar5].super_btBroadphaseProxy.m_aabbMax + 1) + lVar8) =
         (short)(uVar6 - 1);
    *(short *)((long)pHVar2[uVar5].m_maxEdges + lVar8) = (short)uVar4;
  }
  sortMinDown(this,0,*(unsigned_short *)&pHVar2[uVar5].super_btBroadphaseProxy.field_0x3c,dispatcher
              ,false);
  sortMaxDown(this,0,pHVar2[uVar5].m_maxEdges[0],dispatcher,false);
  sortMinDown(this,1,*(unsigned_short *)&pHVar2[uVar5].super_btBroadphaseProxy.field_0x3e,dispatcher
              ,false);
  sortMaxDown(this,1,pHVar2[uVar5].m_maxEdges[1],dispatcher,false);
  sortMinDown(this,2,*(unsigned_short *)&pHVar2[uVar5].field_0x40,dispatcher,true);
  sortMaxDown(this,2,pHVar2[uVar5].m_maxEdges[2],dispatcher,true);
  return uVar5;
}

Assistant:

BP_FP_INT_TYPE btAxisSweep3Internal<BP_FP_INT_TYPE>::addHandle(const btVector3& aabbMin,const btVector3& aabbMax, void* pOwner,short int collisionFilterGroup,short int collisionFilterMask,btDispatcher* dispatcher,void* multiSapProxy)
{
	// quantize the bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// allocate a handle
	BP_FP_INT_TYPE handle = allocHandle();
	

	Handle* pHandle = getHandle(handle);
	
	pHandle->m_uniqueId = static_cast<int>(handle);
	//pHandle->m_pOverlaps = 0;
	pHandle->m_clientObject = pOwner;
	pHandle->m_collisionFilterGroup = collisionFilterGroup;
	pHandle->m_collisionFilterMask = collisionFilterMask;
	pHandle->m_multiSapParentProxy = multiSapProxy;

	// compute current limit of edge arrays
	BP_FP_INT_TYPE limit = static_cast<BP_FP_INT_TYPE>(m_numHandles * 2);

	
	// insert new edges just inside the max boundary edge
	for (BP_FP_INT_TYPE axis = 0; axis < 3; axis++)
	{

		m_pHandles[0].m_maxEdges[axis] += 2;

		m_pEdges[axis][limit + 1] = m_pEdges[axis][limit - 1];

		m_pEdges[axis][limit - 1].m_pos = min[axis];
		m_pEdges[axis][limit - 1].m_handle = handle;

		m_pEdges[axis][limit].m_pos = max[axis];
		m_pEdges[axis][limit].m_handle = handle;

		pHandle->m_minEdges[axis] = static_cast<BP_FP_INT_TYPE>(limit - 1);
		pHandle->m_maxEdges[axis] = limit;
	}

	// now sort the new edges to their correct position
	sortMinDown(0, pHandle->m_minEdges[0], dispatcher,false);
	sortMaxDown(0, pHandle->m_maxEdges[0], dispatcher,false);
	sortMinDown(1, pHandle->m_minEdges[1], dispatcher,false);
	sortMaxDown(1, pHandle->m_maxEdges[1], dispatcher,false);
	sortMinDown(2, pHandle->m_minEdges[2], dispatcher,true);
	sortMaxDown(2, pHandle->m_maxEdges[2], dispatcher,true);


	return handle;
}